

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O0

int ON_SearchMonotoneArray(double *array,int length,double t)

{
  int iVar1;
  int local_38;
  int local_34;
  int local_30;
  int i1;
  int i0;
  int i;
  double t_local;
  int length_local;
  double *array_local;
  
  if ((array == (double *)0x0) || (length < 1)) {
    array_local._4_4_ = -2;
  }
  else {
    local_38 = length + -1;
    if (*array <= t) {
      if (t < array[local_38]) {
        if (array[1] <= t) {
          if (t < array[length + -2]) {
            local_30 = 0;
            while( true ) {
              local_34 = local_38;
              if ((array[local_30] != array[local_30 + 1]) ||
                 (NAN(array[local_30]) || NAN(array[local_30 + 1]))) break;
              local_30 = local_30 + 1;
            }
            while( true ) {
              if ((array[local_34] != array[local_34 + -1]) ||
                 (NAN(array[local_34]) || NAN(array[local_34 + -1]))) break;
              local_34 = local_34 + -1;
            }
            while (local_30 + 1 < local_34) {
              iVar1 = local_30 + local_34 >> 1;
              if (array[iVar1] <= t) {
                while( true ) {
                  local_30 = iVar1;
                  if ((array[local_30] != array[local_30 + 1]) ||
                     (NAN(array[local_30]) || NAN(array[local_30 + 1]))) break;
                  iVar1 = local_30 + 1;
                }
              }
              else {
                while( true ) {
                  local_34 = iVar1;
                  if ((array[local_34] != array[local_34 + -1]) ||
                     (NAN(array[local_34]) || NAN(array[local_34 + -1]))) break;
                  iVar1 = local_34 + -1;
                }
              }
            }
            array_local._4_4_ = local_30;
          }
          else {
            array_local._4_4_ = length + -2;
          }
        }
        else {
          array_local._4_4_ = 0;
        }
      }
      else {
        if (array[local_38] <= t && t != array[local_38]) {
          local_38 = length;
        }
        array_local._4_4_ = local_38;
      }
    }
    else {
      array_local._4_4_ = -1;
    }
  }
  return array_local._4_4_;
}

Assistant:

int 
ON_SearchMonotoneArray(const double* array, int length, double t)
/*****************************************************************************
Find interval in an increasing array of doubles
 
INPUT:
  array
    A monotone increasing (array[i] <= array[i+1]) array of length doubles.
  length (>=1)
    number of doubles in array
  t
    parameter
OUTPUT:
  ON_GetdblArrayIndex()
    -1:         t < array[0]
     i:         (0 <= i <= length-2) array[i] <= t < array[i+1]
     length-1:  t == array[length-1]
     length:    t  > array[length-1]
COMMENTS:
  If length < 1 or array is not monotone increasing, you will get a meaningless
  answer and may crash your program.
EXAMPLE:
  // Given a "t", find the knots that define the span used to evaluate a
  // nurb at t; i.e., find "i" so that
  // knot[i] <= ... <= knot[i+order-2] 
  //   <= t < knot[i+order-1] <= ... <= knot[i+2*(order-1)-1]
  i = ON_GetdblArrayIndex(knot+order-2,cv_count-order+2,t);
  if (i < 0) i = 0; else if (i > cv_count - order) i = cv_count - order;
RELATED FUNCTIONS:
  ON_
  ON_
*****************************************************************************/

{                 
  int 
    i, i0, i1;

  if (0 == array || length < 1)
    return -2; // check for empty input to prevent crashes RH-23451

  length--;

  /* Since t is frequently near the ends and bisection takes the
   * longest near the ends, trap those cases here.
   */
  if (t < array[0]) 
    return -1;
  if (t >= array[length])
    return (t > array[length]) ? length+1 : length;
  if (t < array[1])
    return 0;
  if (t >= array[length-1])
    return (length-1);


  i0 = 0;
  i1 = length;
  while (array[i0] == array[i0+1]) i0++;
  while (array[i1] == array[i1-1]) i1--;
  /* From now on we have 
   *  1.) array[i0] <= t < array[i1] 
   *  2.) i0 <= i < i1.
   * When i0+1 == i1, we have array[i0] <= t < array[i0+1] 
   * and i0 is the answer we seek.
   */
  while (i0+1 < i1) {
    i = (i0+i1)>>1;
    if (t < array[i]) {
      i1 = i;
      while (array[i1] == array[i1-1]) i1--;
    }
    else {
      i0 = i;
      while (array[i0] == array[i0+1]) i0++;
    }
  }

  return i0;
}